

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Firework.cpp
# Opt level: O0

void __thiscall Firework::displayFireworkExplosion(Firework *this,Screen *screen)

{
  uint uVar1;
  long lVar2;
  Screen *this_00;
  int iVar3;
  int y_00;
  string *psVar4;
  double dVar5;
  undefined8 uStack_100;
  Screen *local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  Firework *local_d0;
  ulong local_c8;
  long local_c0;
  string local_b8 [55];
  char local_81;
  int local_80;
  int iStack_7c;
  bool flag;
  int cy;
  int cx;
  int y;
  int x;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  int local_58;
  int local_54;
  int startCursorPosition [2];
  int k;
  int j;
  double i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  image;
  double explosionTotalTime;
  double explosionCycleFrames;
  Screen *screen_local;
  Firework *this_local;
  
  image.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x3ff8000000000000;
  uStack_100 = 0x135d63;
  local_d0 = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&i);
  local_58 = local_d0->endPosition[0] - local_d0->explosionDiameter / 2;
  local_54 = local_d0->endPosition[1] - local_d0->explosionDiameter / 2;
  local_c8 = (ulong)(uint)local_d0->explosionDiameter;
  lVar2 = -(local_c8 * local_c8 + 0xf & 0xfffffffffffffff0);
  local_c0 = (long)&local_f8 + lVar2;
  for (startCursorPosition[1] = 0; startCursorPosition[1] < local_d0->explosionDiameter;
      startCursorPosition[1] = startCursorPosition[1] + 1) {
    for (startCursorPosition[0] = 0; startCursorPosition[0] < local_d0->explosionDiameter;
        startCursorPosition[0] = startCursorPosition[0] + 1) {
      *(undefined1 *)
       (local_c0 + (long)startCursorPosition[1] * local_c8 + (long)startCursorPosition[0]) = 0;
    }
  }
  iStack_7c = local_d0->explosionDiameter / 2;
  local_80 = local_d0->explosionDiameter / 2;
  _y = local_c8;
  __vla_expr1 = local_c8;
  __vla_expr0 = (unsigned_long)&local_f8;
  for (_k = 0.0; _k <= 6.28318530718; _k = _k + 0.008726646259972222) {
    local_f0 = (double)iStack_7c;
    local_e8 = (double)(local_d0->explosionDiameter / 2);
    *(undefined8 *)((long)&uStack_100 + lVar2) = 0x135ece;
    dVar5 = cos(_k);
    cx = (int)(local_e8 * dVar5 + local_f0);
    local_e0 = (double)local_80;
    local_d8 = (double)(local_d0->explosionDiameter / 2);
    *(undefined8 *)((long)&uStack_100 + lVar2) = 0x135f28;
    dVar5 = sin(_k);
    iVar3 = (int)(local_d8 * dVar5 + local_e0);
    *(undefined1 *)(local_c0 + (long)iVar3 * local_c8 + (long)cx) = 1;
    cy = iVar3;
  }
  local_81 = '\0';
  for (startCursorPosition[1] = 0; startCursorPosition[1] < local_d0->explosionDiameter;
      startCursorPosition[1] = startCursorPosition[1] + 1) {
    for (startCursorPosition[0] = 0; startCursorPosition[0] < local_d0->explosionDiameter;
        startCursorPosition[0] = startCursorPosition[0] + 1) {
      if (((((*(byte *)(local_c0 + (long)startCursorPosition[1] * local_c8 +
                       (long)startCursorPosition[0]) & 1) == 0) || (local_81 != '\0')) ||
          (startCursorPosition[1] == 0)) ||
         (startCursorPosition[1] == local_d0->explosionDiameter + -1)) {
        if (((*(byte *)(local_c0 + (long)startCursorPosition[1] * local_c8 +
                       (long)startCursorPosition[0]) & 1) == 0) || (local_81 == '\0')) {
          if (local_81 != '\0') {
            *(undefined1 *)
             (local_c0 + (long)startCursorPosition[1] * local_c8 + (long)startCursorPosition[0]) = 1
            ;
          }
        }
        else {
          local_81 = '\0';
        }
      }
      else {
        local_81 = '\x01';
      }
    }
  }
  uVar1 = local_d0->explosionColor;
  *(undefined8 *)((long)&uStack_100 + lVar2) = 0x1360a2;
  Screen::turnAttrOn(screen,(uVar1 & 0xff) << 8);
  if ((double)image.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage <= local_d0->explosionFrameCounter)
  {
    local_d0->fireworkStage = 4;
  }
  else {
    for (startCursorPosition[1] = 0; startCursorPosition[1] < local_d0->explosionDiameter;
        startCursorPosition[1] = startCursorPosition[1] + 1) {
      for (startCursorPosition[0] = 0; startCursorPosition[0] < local_d0->explosionDiameter;
          startCursorPosition[0] = startCursorPosition[0] + 1) {
        if ((*(byte *)(local_c0 + (long)startCursorPosition[1] * local_c8 +
                      (long)startCursorPosition[0]) & 1) != 0) {
          *(undefined8 *)((long)&uStack_100 + lVar2) = 0x136128;
          iVar3 = rand();
          if (iVar3 % 2 != 0) {
            psVar4 = &local_d0->explosionParticle;
            local_f8 = screen;
            *(undefined8 *)((long)&uStack_100 + lVar2) = 0x13615b;
            std::__cxx11::string::string(local_b8,(string *)psVar4);
            this_00 = local_f8;
            y_00 = local_58 + startCursorPosition[1];
            iVar3 = local_54 + startCursorPosition[0];
            *(undefined8 *)((long)&uStack_100 + lVar2) = 0x136180;
            Screen::printString(this_00,(string *)local_b8,y_00,iVar3);
            *(undefined8 *)((long)&uStack_100 + lVar2) = 0x13618e;
            std::__cxx11::string::~string(local_b8);
          }
        }
      }
    }
    local_d0->explosionFrameCounter = local_d0->explosionFrameCounter + 0.125;
  }
  uVar1 = local_d0->explosionColor;
  *(undefined8 *)((long)&uStack_100 + lVar2) = 0x136243;
  Screen::turnAttrOff(screen,(uVar1 & 0xff) << 8);
  *(undefined8 *)(__vla_expr0 - 8) = 0x136255;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&i);
  return;
}

Assistant:

void Firework::displayFireworkExplosion(Screen &screen) {
    double explosionCycleFrames = 3;      /* The number of frames to display the explosion circle                 */
    double explosionTotalTime = 1.5;         /* The total time, in seconds, to display the explosion circle          */

    std::vector<std::string> image;
    double i;
    int j, k;


    // Calculate the start coordinates for printing the 2d string array
    int startCursorPosition[2];
    startCursorPosition[0] = endPosition[0] - (explosionDiameter / 2);
    startCursorPosition[1] = endPosition[1] - (explosionDiameter / 2);

    // Generate the image boundaries
    bool boundaries[explosionDiameter][explosionDiameter];
    for (j = 0; j < explosionDiameter; j++){
        for(k = 0; k < explosionDiameter; k++){
            boundaries[j][k] = false;
        }
    }

    int x, y;
    const int cx = explosionDiameter / 2;
    const int cy = explosionDiameter / 2;
    for(i = 0; i <= (2 * PI); i+= (PI / 360) ){
        // Calculate a point on the edge of the circle
        x = (int)( cx + (explosionDiameter / 2) * cos(i) );
        y = (int)( cy + (explosionDiameter / 2) * sin(i) );

        // Store that point in the boundary array
        boundaries[y][x] = true;
    }

    // Fill in the boundary circle

    bool flag = false;
    for (j = 0; j < explosionDiameter; j++){
        for(k = 0; k < explosionDiameter; k++){
            if(boundaries[j][k] && !flag && j != 0 && j != (explosionDiameter - 1)){
                // Turn on the filling property
                flag = true;
            }
            else if(boundaries[j][k] && flag){
                // The other edge of the boundary circle has been reached
                flag = false;
            }
            else if(flag){
                boundaries[j][k] = true;
            }
        }
    }


    // Generate the image


    // Print the image
    screen.turnAttrOn(COLOR_PAIR(explosionColor));


    if(explosionFrameCounter < explosionTotalTime){
        for (j = 0; j < explosionDiameter; j++){
            for(k = 0; k < explosionDiameter; k++){
                if(boundaries[j][k]){
                    if(rand() % 2){
                        screen.printString(explosionParticle, startCursorPosition[0] + j, startCursorPosition[1] + k);
                    }
                }
            }
        }
        explosionFrameCounter += (explosionCycleFrames / FRAMES_PER_SECOND);
    }
    else{
        fireworkStage = FINISHED;
    }

    screen.turnAttrOff(COLOR_PAIR(explosionColor));
}